

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O1

bool chaiscript::bootstrap::Bootstrap::has_parse_tree(Const_Proxy_Function *t_pf)

{
  element_type *peVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar3;
  
  peVar1 = (t_pf->
           super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    bVar3 = false;
  }
  else {
    lVar2 = __dynamic_cast(peVar1,&dispatch::Proxy_Function_Base::typeinfo,
                           &dispatch::Dynamic_Proxy_Function::typeinfo,0);
    bVar3 = lVar2 != 0;
  }
  if (bVar3 == false) {
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this = (t_pf->
           super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this->_M_use_count = this->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this->_M_use_count = this->_M_use_count + 1;
      }
    }
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return bVar3;
}

Assistant:

static bool has_parse_tree(const chaiscript::Const_Proxy_Function &t_pf) noexcept {
      const auto pf = std::dynamic_pointer_cast<const chaiscript::dispatch::Dynamic_Proxy_Function>(t_pf);
      return bool(pf);
    }